

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall
soul::heart::BranchIf::BranchIf(BranchIf *this,Expression *cond,Block *trueJump,Block *falseJump)

{
  bool condition;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *local_48;
  pool_ref<soul::heart::Block> local_30;
  Block *local_28;
  Block *falseJump_local;
  Block *trueJump_local;
  Expression *cond_local;
  BranchIf *this_local;
  
  local_28 = falseJump;
  falseJump_local = trueJump;
  trueJump_local = (Block *)cond;
  cond_local = (Expression *)this;
  Terminator::Terminator(&this->super_Terminator);
  (this->super_Terminator).super_Object._vptr_Object = (_func_int **)&PTR__BranchIf_0058b408;
  pool_ref<soul::heart::Expression>::pool_ref<soul::heart::Expression,void>
            (&this->condition,(Expression *)trueJump_local);
  pool_ref<soul::heart::Block>::pool_ref<soul::heart::Block,void>(this->targets,falseJump_local);
  pool_ref<soul::heart::Block>::pool_ref<soul::heart::Block,void>(this->targets + 1,local_28);
  local_48 = this->targetArgs;
  do {
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::ArrayWithPreallocation
              (local_48);
    local_48 = local_48 + 1;
  } while ((BranchIf *)local_48 != this + 1);
  local_30.object = this->targets[1].object;
  condition = pool_ref<soul::heart::Block>::operator!=(this->targets,&local_30);
  checkAssertion(condition,"targets[0] != targets[1]","BranchIf",0x452);
  pool_ref<soul::heart::Block>::~pool_ref(&local_30);
  return;
}

Assistant:

BranchIf (Expression& cond, Block& trueJump, Block& falseJump)
            : condition (cond), targets { trueJump, falseJump }
        {
            SOUL_ASSERT (targets[0] != targets[1]);
        }